

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

bool xercesc_4_0::XMLUri::isValidRegistryBasedAuthority(XMLCh *authority,XMLSize_t authLen)

{
  bool bVar1;
  int iVar2;
  ulong local_28;
  XMLSize_t index;
  XMLSize_t authLen_local;
  XMLCh *authority_local;
  
  local_28 = 0;
  while( true ) {
    while( true ) {
      if (authLen <= local_28) {
        return true;
      }
      bVar1 = isUnreservedCharacter(authority[local_28]);
      if ((!bVar1) &&
         (iVar2 = XMLString::indexOf((XMLCh *)REG_NAME_CHARACTERS,authority[local_28]), iVar2 == -1)
         ) break;
      local_28 = local_28 + 1;
    }
    if (authority[local_28] != L'%') break;
    if (((authLen <= local_28 + 2) || (bVar1 = XMLString::isHex(authority[local_28 + 1]), !bVar1))
       || (bVar1 = XMLString::isHex(authority[local_28 + 2]), !bVar1)) {
      return false;
    }
    local_28 = local_28 + 3;
  }
  return false;
}

Assistant:

bool XMLUri::isValidRegistryBasedAuthority(const XMLCh* const authority,
                                           const XMLSize_t authLen)
{
    // check authority
    XMLSize_t index = 0;
    while (index < authLen)
    {
        if (isUnreservedCharacter(authority[index]) ||
            (XMLString::indexOf(REG_NAME_CHARACTERS, authority[index]) != -1))
        {
            index++;
        }
        else if (authority[index] == chPercent)               // '%'
        {
            if (index + 2 < authLen
                && XMLString::isHex(authority[index+1])       // 1st hex
                && XMLString::isHex(authority[index+2])  )    // 2nd hex
                index +=3;
            else
                return false;
        }
        else
            return false;
    } //while

    return true;
}